

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int normal_scanRef(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  ATTRIBUTE *pAVar5;
  undefined1 *puVar6;
  long lVar7;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  int iVar8;
  int iVar9;
  byte *pbVar10;
  byte *pbVar11;
  
  pAVar5 = (ATTRIBUTE *)(end + -(long)ptr);
  if ((long)pAVar5 < 1) {
    return -1;
  }
  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  iVar8 = 0;
  pbVar10 = (byte *)ptr;
  iVar9 = iVar8;
  if (bVar1 < 0x13) {
    if (bVar1 == 5) {
      if (pAVar5 == (ATTRIBUTE *)&DAT_00000001) {
        return -2;
      }
      iVar3 = (*enc[3].nameLength)(enc,ptr);
      if (iVar3 == 0) {
        iVar3 = (*enc[3].literalScanners[0])(enc,ptr,extraout_RDX_00,&pAVar5->name);
        goto LAB_0058dcb1;
      }
    }
    else if (bVar1 == 6) {
      if ((long)pAVar5 < 3) {
        return -2;
      }
      pcVar4 = (*enc[3].skipS)(enc,ptr);
      if ((int)pcVar4 == 0) {
        iVar3 = (*enc[3].literalScanners[1])(enc,ptr,extraout_RDX_01,&pAVar5->name);
        goto LAB_0058dc86;
      }
    }
    else {
      iVar9 = 0;
      if (bVar1 == 7) {
        if ((long)pAVar5 < 4) {
          return -2;
        }
        iVar3 = (*enc[3].getAtts)(enc,ptr,7,pAVar5);
        iVar9 = iVar8;
        if (iVar3 == 0) {
          iVar3 = (*enc[3].nameMatchesAscii)(enc,ptr,extraout_RDX,(char *)pAVar5);
          while( true ) {
            lVar7 = 4;
            while( true ) {
              while( true ) {
                pbVar10 = (byte *)ptr;
                iVar9 = iVar8;
                if (iVar3 == 0) goto LAB_0058dcbe;
LAB_0058dbd6:
                while( true ) {
                  ptr = (char *)((byte *)ptr + lVar7);
                  lVar7 = (long)end - (long)ptr;
                  if (lVar7 < 1) {
                    return -1;
                  }
                  pAVar5 = (ATTRIBUTE *)(ulong)(byte)*ptr;
                  bVar1 = *(byte *)((long)&pAVar5->name + (long)enc[1].scanners);
                  pbVar10 = (byte *)ptr;
                  if (bVar1 < 0x12) break;
                  lVar7 = 1;
                  if ((3 < bVar1 - 0x18) && (bVar1 != 0x16)) {
                    iVar9 = iVar8;
                    if (bVar1 == 0x12) {
                      pbVar10 = (byte *)ptr + 1;
                      iVar9 = 9;
                    }
                    goto LAB_0058dcbe;
                  }
                }
                if (bVar1 != 5) break;
                if (lVar7 == 1) {
                  return -2;
                }
                iVar3 = (*enc[3].nameLength)(enc,ptr);
                iVar9 = iVar8;
                if (iVar3 != 0) goto LAB_0058dcbe;
                iVar3 = (*enc[3].scanners[0])(enc,ptr,extraout_RDX_04,&pAVar5->name);
LAB_0058dcb1:
                lVar7 = 2;
              }
              if (bVar1 != 6) break;
              if (lVar7 < 3) {
                return -2;
              }
              pcVar4 = (*enc[3].skipS)(enc,ptr);
              iVar9 = iVar8;
              if ((int)pcVar4 != 0) goto LAB_0058dcbe;
              iVar3 = (*enc[3].scanners[1])(enc,ptr,extraout_RDX_03,&pAVar5->name);
LAB_0058dc86:
              lVar7 = 3;
            }
            iVar9 = iVar8;
            if (bVar1 != 7) break;
            if (lVar7 < 4) {
              return -2;
            }
            iVar3 = (*enc[3].getAtts)(enc,ptr,(uint)bVar1,pAVar5);
            if (iVar3 != 0) break;
            iVar3 = (*enc[3].scanners[2])(enc,ptr,extraout_RDX_02,&pAVar5->name);
          }
        }
      }
    }
  }
  else if (bVar1 == 0x13) {
    pbVar10 = (byte *)(ptr + 1);
    if ((byte *)end == pbVar10 || (long)end - (long)pbVar10 < 0) {
      return -1;
    }
    if ((ulong)*pbVar10 == 0x78) {
      pbVar10 = (byte *)(ptr + 2);
      if ((byte *)end == pbVar10 || (long)end - (long)pbVar10 < 0) {
        return -1;
      }
      if ((*(byte *)((long)enc[1].scanners + (ulong)*pbVar10) & 0xfe) != 0x18) goto LAB_0058dcbe;
      pbVar10 = (byte *)(ptr + 3);
      lVar7 = (long)end - (long)pbVar10;
      while( true ) {
        if (lVar7 < 1) {
          return -1;
        }
        bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar10);
        if (1 < bVar1 - 0x18) break;
        pbVar10 = pbVar10 + 1;
        lVar7 = lVar7 + -1;
      }
      if (bVar1 != 0x12) goto LAB_0058dcbe;
      pbVar11 = pbVar10 + 1;
    }
    else {
      if (*(char *)((long)enc[1].scanners + (ulong)*pbVar10) != '\x19') goto LAB_0058dcbe;
      puVar6 = &pAVar5[-1].field_0x1e;
      pbVar11 = (byte *)(ptr + 2);
      do {
        pbVar10 = pbVar11;
        if ((long)puVar6 < 1) {
          return -1;
        }
        cVar2 = *(char *)((long)enc[1].scanners + (ulong)*pbVar10);
        pbVar11 = pbVar10 + 1;
        puVar6 = puVar6 + -1;
      } while (cVar2 == '\x19');
      if (cVar2 != '\x12') goto LAB_0058dcbe;
    }
    pbVar10 = pbVar11;
    iVar9 = 10;
  }
  else {
    lVar7 = 1;
    if (bVar1 == 0x16) goto LAB_0058dbd6;
    if (bVar1 == 0x18) goto LAB_0058dbd6;
  }
LAB_0058dcbe:
  *nextTokPtr = (char *)pbVar10;
  return iVar9;
}

Assistant:

static int PTRCALL
PREFIX(scanRef)(const ENCODING *enc, const char *ptr, const char *end,
                const char **nextTokPtr) {
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_NUM:
    return PREFIX(scanCharRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}